

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

_Bool prof_gdump_set(tsdn_t *tsdn,_Bool gdump)

{
  _Bool _Var1;
  byte in_SIL;
  malloc_mutex_t *in_RDI;
  tsdn_t *unaff_retaddr;
  undefined7 in_stack_00000008;
  _Bool prof_gdump_old;
  
  malloc_mutex_lock((tsdn_t *)CONCAT17(gdump,in_stack_00000008),(malloc_mutex_t *)unaff_retaddr);
  _Var1 = (_Bool)(prof_gdump_val & 1);
  prof_gdump_val = (_Bool)(in_SIL & 1);
  malloc_mutex_unlock(unaff_retaddr,in_RDI);
  return _Var1;
}

Assistant:

bool
prof_gdump_set(tsdn_t *tsdn, bool gdump) {
	bool prof_gdump_old;

	malloc_mutex_lock(tsdn, &prof_gdump_mtx);
	prof_gdump_old = prof_gdump_val;
	prof_gdump_val = gdump;
	malloc_mutex_unlock(tsdn, &prof_gdump_mtx);
	return prof_gdump_old;
}